

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall ON_CurveProxyHistory::Write(ON_CurveProxyHistory *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_CurveProxyHistory *this_local;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,1);
  if (bVar1) {
    this_local._7_1_ = false;
    bVar1 = ON_ObjRef::Write(&this->m_curve_ref,file);
    if ((((bVar1) &&
         (bVar1 = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bReversed & 1)), bVar1)) &&
        (bVar1 = ON_BinaryArchive::WriteInterval(file,&this->m_full_real_curve_domain), bVar1)) &&
       (((bVar1 = ON_BinaryArchive::WriteInterval(file,&this->m_sub_real_curve_domain), bVar1 &&
         (bVar1 = ON_BinaryArchive::WriteInterval(file,&this->m_proxy_curve_domain), bVar1)) &&
        ((bVar1 = ON_BinaryArchive::WriteInterval(file,&this->m_segment_edge_domain), bVar1 &&
         (bVar1 = ON_BinaryArchive::WriteInterval(file,&this->m_segment_trim_domain), bVar1)))))) {
      this_local._7_1_ = true;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_CurveProxyHistory::Write( ON_BinaryArchive& file ) const
{
  if ( !file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK,1,1) )
    return false;

  bool rc = false;
  for(;;)
  {
    if ( !m_curve_ref.Write(file) )
      break;
    if ( !file.WriteBool(m_bReversed) )
      break;
    if ( !file.WriteInterval(m_full_real_curve_domain) )
      break;
    if ( !file.WriteInterval(m_sub_real_curve_domain) )
      break;
    if (!file.WriteInterval(m_proxy_curve_domain))
      break;
    // Added in version 1,1
    if (!file.WriteInterval(m_segment_edge_domain))
      break;
    if (!file.WriteInterval(m_segment_trim_domain))
      break;
    rc = true;
    break;
  }

  if ( !file.EndWrite3dmChunk() )
    rc = false;
  return rc;
}